

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

int nn_msgqueue_recv(nn_msgqueue *self,nn_msg *msg)

{
  size_t sVar1;
  size_t sVar2;
  long in_RDI;
  nn_msgqueue_chunk *o;
  nn_msg *in_stack_ffffffffffffffd8;
  nn_msg *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_4 = -0xb;
  }
  else {
    nn_msg_mv(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    if (*(int *)(in_RDI + 0x18) == 0x7e) {
      in_stack_ffffffffffffffe0 = *(nn_msg **)(in_RDI + 0x10);
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x2f40);
      *(undefined4 *)(in_RDI + 0x18) = 0;
      if (*(long *)(in_RDI + 0x38) == 0) {
        *(nn_msg **)(in_RDI + 0x38) = in_stack_ffffffffffffffe0;
      }
      else {
        nn_free((void *)0x1654ba);
      }
    }
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
    sVar1 = nn_chunkref_size(&in_stack_ffffffffffffffe0->sphdr);
    sVar2 = nn_chunkref_size(&in_stack_ffffffffffffffe0->sphdr);
    *(size_t *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - (sVar1 + sVar2);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_msgqueue_recv (struct nn_msgqueue *self, struct nn_msg *msg)
{
    struct nn_msgqueue_chunk *o;

    /*  If there is no message in the queue. */
    if (nn_slow (!self->count))
        return -EAGAIN;

    /*  Move the message from the pipe to the user. */
    nn_msg_mv (msg, &self->in.chunk->msgs [self->in.pos]);

    /*  Move to the next position. */
    ++self->in.pos;
    if (nn_slow (self->in.pos == NN_MSGQUEUE_GRANULARITY)) {
        o = self->in.chunk;
        self->in.chunk = self->in.chunk->next;
        self->in.pos = 0;
        if (nn_fast (!self->cache))
            self->cache = o;
        else
            nn_free (o);
    }

    /*  Adjust the statistics. */
    --self->count;
    self->mem -= (nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));

    return 0;
}